

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nxdn.cpp
# Opt level: O0

bool __thiscall DSDcc::DSDNXDN::CACLong::decode(CACLong *this)

{
  bool bVar1;
  ostream *poVar2;
  long lVar3;
  int iVar4;
  CNXDNConvolution *in_RDI;
  uint8_t s1;
  uint8_t s0;
  uint i;
  int n;
  CNXDNConvolution conv;
  CNXDNConvolution *in_stack_ffffffffffffff80;
  uint in_stack_ffffffffffffff8c;
  uint local_54;
  int local_50;
  CNXDNConvolution local_40;
  byte local_1;
  
  CNXDNConvolution::CNXDNConvolution(in_stack_ffffffffffffff80);
  CNXDNConvolution::start(in_stack_ffffffffffffff80);
  local_50 = 0;
  for (local_54 = 0; local_54 < 0xa0; local_54 = local_54 + 1) {
    lVar3 = (long)local_50;
    iVar4 = local_50 + 1;
    local_50 = local_50 + 2;
    CNXDNConvolution::decode
              (&local_40,*(uint8_t *)((long)&in_RDI[6].m_oldMetrics + lVar3 + 4),
               *(uint8_t *)((long)&in_RDI[6].m_oldMetrics + (long)iVar4 + 4));
  }
  CNXDNConvolution::chainback(&local_40,(uchar *)&in_RDI[0xf].m_metrics2,0x9c);
  bVar1 = CNXDNCRC::checkCRC16((uchar *)in_RDI,in_stack_ffffffffffffff8c);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"DSDNXDN::CACLong::decode: CRC OK");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"DSDNXDN::CACLong::decode: bad CRC");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  local_1 = bVar1;
  CNXDNConvolution::~CNXDNConvolution(in_RDI);
  return (bool)(local_1 & 1);
}

Assistant:

bool DSDNXDN::CACLong::decode()
{
    CNXDNConvolution conv;
    conv.start();
    int n = 0;

    for (unsigned int i = 0U; i < 160U; i++)
    {
        uint8_t s0 = m_temp[n++];
        uint8_t s1 = m_temp[n++];

        conv.decode(s0, s1);
    }

    conv.chainback(m_data, 156U);

    if (!CNXDNCRC::checkCRC16(m_data, 136))
    {
        std::cerr << "DSDNXDN::CACLong::decode: bad CRC" << std::endl;
        return false;
    }
    else
    {
        std::cerr << "DSDNXDN::CACLong::decode: CRC OK" << std::endl;
        return true;
    }
}